

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

void cf2_outline_init(CF2_Outline outline,FT_Memory memory,FT_Error *error)

{
  FT_Error *error_local;
  FT_Memory memory_local;
  CF2_Outline outline_local;
  
  memset(outline,0,0x40);
  (outline->root).memory = memory;
  (outline->root).error = error;
  (outline->root).moveTo = cf2_builder_moveTo;
  (outline->root).lineTo = cf2_builder_lineTo;
  (outline->root).cubeTo = cf2_builder_cubeTo;
  return;
}

Assistant:

static void
  cf2_outline_init( CF2_Outline  outline,
                    FT_Memory    memory,
                    FT_Error*    error )
  {
    FT_ZERO( outline );

    outline->root.memory = memory;
    outline->root.error  = error;

    outline->root.moveTo = cf2_builder_moveTo;
    outline->root.lineTo = cf2_builder_lineTo;
    outline->root.cubeTo = cf2_builder_cubeTo;
  }